

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingbox.h
# Opt level: O2

BoundingBox *
BoundingBox::v3(BoundingBox *__return_storage_ptr__,Vector3f *v0,Vector3f *v1,Vector3f *v2)

{
  float fVar1;
  float *pfVar2;
  int c;
  int iVar3;
  Vector3f mx;
  Vector3f mi;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  
  Vector3f::Vector3f(&local_54,v0);
  Vector3f::Vector3f(&local_60,v0);
  for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
    pfVar2 = Vector3f::operator[](v1,iVar3);
    fVar1 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_54,iVar3);
    if (fVar1 < *pfVar2) {
      pfVar2 = Vector3f::operator[](v1,iVar3);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_54,iVar3);
      *pfVar2 = fVar1;
    }
    pfVar2 = Vector3f::operator[](v1,iVar3);
    fVar1 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_60,iVar3);
    if (*pfVar2 < fVar1) {
      pfVar2 = Vector3f::operator[](v1,iVar3);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_60,iVar3);
      *pfVar2 = fVar1;
    }
  }
  for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
    pfVar2 = Vector3f::operator[](v2,iVar3);
    fVar1 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_54,iVar3);
    if (fVar1 < *pfVar2) {
      pfVar2 = Vector3f::operator[](v2,iVar3);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_54,iVar3);
      *pfVar2 = fVar1;
    }
    pfVar2 = Vector3f::operator[](v2,iVar3);
    fVar1 = *pfVar2;
    pfVar2 = Vector3f::operator[](&local_60,iVar3);
    if (*pfVar2 < fVar1) {
      pfVar2 = Vector3f::operator[](v2,iVar3);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_60,iVar3);
      *pfVar2 = fVar1;
    }
  }
  Vector3f::Vector3f(&local_3c,&local_54);
  Vector3f::Vector3f(&local_48,&local_60);
  BoundingBox(__return_storage_ptr__,&local_3c,&local_48);
  return __return_storage_ptr__;
}

Assistant:

static BoundingBox v3(Vector3f v0, Vector3f v1, Vector3f v2)
	{
		Vector3f mi = v0, mx = v0;
		for (int c = 0; c < 3; ++c)
		{
			if (v1[c] < mi[c]) mi[c] = v1[c];
			if (v1[c] > mx[c]) mx[c] = v1[c];
		}
		for (int c = 0; c < 3; ++c)
		{
			if (v2[c] < mi[c]) mi[c] = v2[c];
			if (v2[c] > mx[c]) mx[c] = v2[c];
		}
		return BoundingBox(mi, mx);
	}